

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceVisitor.hpp
# Opt level: O2

void __thiscall netlist::InstanceVisitor::handle(InstanceVisitor *this,InstanceSymbol *symbol)

{
  bool bVar1;
  string local_40;
  
  slang::ast::Symbol::getHierarchicalPath_abi_cxx11_(&local_40,(Symbol *)symbol);
  bVar1 = std::operator==(&local_40,"$unit");
  std::__cxx11::string::~string((string *)&local_40);
  if (!bVar1) {
    handleInstanceMemberVars(this,symbol);
    handleInstanceMemberPorts(this,symbol);
    handleInstanceExtPorts(this,symbol);
    slang::ast::Symbol::visit<netlist::InstanceVisitor&>(&symbol->body->super_Symbol,this);
  }
  return;
}

Assistant:

void handle(const ast::InstanceSymbol& symbol) {
        DEBUG_PRINT("Instance: {}\n", symbol.getHierarchicalPath());

        if (symbol.getHierarchicalPath() == "$unit") {
            // An instance without a name has been excluded from the design.
            // This can happen when the --top option is used and there is an
            // uninstanced module.
            return;
        }

        handleInstanceMemberVars(symbol);
        handleInstanceMemberPorts(symbol);
        handleInstanceExtPorts(symbol);

        symbol.body.visit(*this);
    }